

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O2

double __thiscall N::histo<double>(N *this,Alg<double> *alg,vector<N_*,_std::allocator<N_*>_> *line)

{
  pointer *pppNVar1;
  double dVar2;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> output;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  N r;
  anon_class_64_3_558eef7f local_130;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCStack_d8;
  CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N> local_d0 [32];
  N local_b0;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_38;
  
  local_b0.osi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,__gnu_cxx::__ops::_Iter_equals_val<N*const>>
                    ((line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var3._M_current ==
      (line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_b0.osi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this;
    std::vector<N*,std::allocator<N*>>::emplace_back<N*>
              ((vector<N*,std::allocator<N*>> *)line,(N **)&local_b0);
    N(&local_b0,this);
    all(this);
    std::function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::function
              (&local_130.alg,alg);
    std::vector<N_*,_std::allocator<N_*>_>::vector(&local_130.line,line);
    local_130.this = this;
    all(&local_b0);
    output._end._M_current = (N **)uStack_e8;
    output._start._M_current = (N **)local_f0;
    output._curr._M_current = (N **)local_e0;
    output.next = pCStack_d8;
    CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
    map<N::histo<double>(std::function<double(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)::_lambda(N*)_1_>
              (&local_38,local_d0,&local_130,output);
    histo<double>(std::function<double(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)
    ::{lambda(N*)#1}::~function((_lambda_N___1_ *)&local_130);
    pppNVar1 = &(line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + -1;
    dVar2 = std::function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::operator()
                      (alg,&local_b0,line);
    ~N(&local_b0);
    uVar4 = SUB84(dVar2,0);
    uVar5 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  else {
    dVar2 = std::function<double_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::operator()
                      (alg,this,line);
    uVar4 = SUB84(dVar2,0);
    uVar5 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  return (double)CONCAT44(uVar5,uVar4);
}

Assistant:

B histo(const alg::Alg<B>& alg, vector<N*> line = {}) {
        if (find(line.begin(), line.end(), this) != line.end()) return alg(*this, line);
        line.push_back(this);

        auto r(*this);
        this->all().map([&, alg, line](N* n){return new (g) N(n->histo(alg, line));}, r.all());

        line.pop_back();
        return alg(r, line);
    }